

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O0

void __thiscall Restaurant::Restaurant(Restaurant *this,string *configFilePath)

{
  byte bVar1;
  bool bVar2;
  DishType d_type;
  int iVar3;
  istream *piVar4;
  long lVar5;
  char *pcVar6;
  size_type sVar7;
  Table *this_00;
  reference pvVar8;
  string local_368 [32];
  undefined1 local_348 [8];
  Dish toBeAdd;
  Table *pTStack_2f0;
  DishType menuDish;
  Table *t;
  int local_2c4;
  undefined1 local_2c0 [4];
  int tablesSize;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newDish;
  string token;
  size_t pos;
  int numOfTables;
  string delimeter;
  string local_258 [8];
  string line;
  istream local_238 [8];
  ifstream myfile;
  allocator local_19;
  string *local_18;
  string *configFilePath_local;
  Restaurant *this_local;
  
  this->_vptr_Restaurant = (_func_int **)&PTR__Restaurant_00120d80;
  this->open = true;
  this->nextCustomerId = 0;
  (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = configFilePath;
  configFilePath_local = (string *)this;
  std::vector<Table_*,_std::allocator<Table_*>_>::vector(&this->tables);
  (this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Dish,_std::allocator<Dish>_>::vector(&this->menu);
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::vector(&this->actionsLog);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->newMsg,"",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  std::ifstream::ifstream(local_238,local_18,8);
  std::__cxx11::string::string(local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&numOfTables,",",(allocator *)((long)&pos + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
  pos._0_4_ = 0x7f;
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_238,local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      std::__cxx11::string::operator+=(local_258,",");
      std::__cxx11::string::string
                ((string *)
                 &newDish.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2c0);
      while( true ) {
        lVar5 = std::__cxx11::string::find(local_258,(ulong)&numOfTables);
        bVar2 = false;
        if (lVar5 != -1) {
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_258);
          bVar2 = *pcVar6 != '#';
        }
        if (!bVar2) break;
        sVar7 = std::vector<Table_*,_std::allocator<Table_*>_>::size(&this->tables);
        local_2c4 = (int)sVar7;
        std::__cxx11::string::substr((ulong)&t,(ulong)local_258);
        std::__cxx11::string::operator=
                  ((string *)
                   &newDish.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&t);
        std::__cxx11::string::~string((string *)&t);
        if ((int)pos == 0x7f) {
          pos._0_4_ = std::__cxx11::stoi((string *)
                                         &newDish.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (size_t *)0x0,10);
          std::__cxx11::string::length();
          std::__cxx11::string::erase((ulong)local_258,0);
        }
        else if (local_2c4 < (int)pos) {
          this_00 = (Table *)operator_new(0x40);
          iVar3 = std::__cxx11::stoi((string *)
                                     &newDish.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (size_t *)0x0,10);
          Table::Table(this_00,iVar3);
          pTStack_2f0 = this_00;
          std::vector<Table_*,_std::allocator<Table_*>_>::push_back
                    (&this->tables,&stack0xfffffffffffffd10);
          std::__cxx11::string::length();
          std::__cxx11::string::erase((ulong)local_258,0);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2c0,
                      (value_type *)
                      &newDish.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::length();
          std::__cxx11::string::erase((ulong)local_258,0);
        }
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2c0);
        if (sVar7 == 3) {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_2c0,1);
          std::__cxx11::string::string((string *)&toBeAdd.price,(string *)pvVar8);
          d_type = findMyType(this,(string *)&toBeAdd.price);
          std::__cxx11::string::~string((string *)&toBeAdd.price);
          sVar7 = std::vector<Dish,_std::allocator<Dish>_>::size(&this->menu);
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_2c0,0);
          std::__cxx11::string::string(local_368,(string *)pvVar8);
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_2c0,2);
          iVar3 = std::__cxx11::stoi(pvVar8,(size_t *)0x0,10);
          Dish::Dish((Dish *)local_348,(int)sVar7,(string *)local_368,iVar3,d_type);
          std::__cxx11::string::~string(local_368);
          std::vector<Dish,_std::allocator<Dish>_>::push_back(&this->menu,(value_type *)local_348);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2c0);
          Dish::~Dish((Dish *)local_348);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2c0);
      std::__cxx11::string::~string
                ((string *)
                 &newDish.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::__cxx11::string::~string((string *)&numOfTables);
  std::__cxx11::string::~string(local_258);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

Restaurant::Restaurant(const std::string &configFilePath) : open(true), nextCustomerId(0), tables(), menu(), actionsLog(), newMsg("")
{
    std::ifstream myfile(configFilePath);
    std::string line;
    std::string delimeter = ",";
    int numOfTables = INT8_MAX;

    if(myfile.is_open())
    {
        while (getline(myfile, line))
        {
            line  += ",";
            size_t pos = 0;
            std::string token;
            std::vector<std::string> newDish;
            while ((pos = line.find(delimeter)) != std::string::npos && line[0] != '#')
            {
                int tablesSize = tables.size();

                token = line.substr(0, pos);
                if(numOfTables == INT8_MAX)
                {
                    numOfTables = std::stoi(token);
                    line.erase(0, pos + delimeter.length());
                }
                else if(tablesSize < numOfTables)
                {
                    auto *t = new Table(std::stoi(token));
                    tables.push_back(t);
                    line.erase(0, pos + delimeter.length());
                }
                else
                {

                    newDish.push_back(token);
                    line.erase(0, pos + delimeter.length());
                }
                if(newDish.size() == 3)
                {
                    DishType menuDish = findMyType(newDish[1]);
                    Dish toBeAdd(static_cast<int>(menu.size()), newDish[0], std::stoi(newDish[2]), menuDish);
                    menu.push_back(toBeAdd);
                    newDish.clear();
                }
            }
        }
    }
}